

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O1

void __thiscall QPngHandlerPrivate::readPngTexts(QPngHandlerPrivate *this,png_info *info)

{
  QStringList *this_00;
  char *pcVar1;
  QString *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QArrayData *pQVar5;
  storage_type *psVar6;
  storage_type *psVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QLatin1String QVar12;
  png_textp text_ptr;
  QString local_d8;
  QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString> local_b8;
  QString local_88;
  QArrayData *local_68;
  char16_t *pcStack_60;
  char *local_58;
  int local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_44 = 0;
  png_get_text(this->png_ptr,info,&local_40,&local_44);
  bVar8 = local_44 != 0;
  local_44 = local_44 + -1;
  if (bVar8) {
    this_00 = &this->readTexts;
    do {
      local_68 = (QArrayData *)0x0;
      pcStack_60 = (char16_t *)0x0;
      local_58 = (char *)0x0;
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (char16_t *)0x0;
      local_88.d.size = 0;
      psVar7 = (storage_type *)0x0;
      if (*(long *)(local_40 + 8) != 0) {
        psVar6 = (storage_type *)0xffffffffffffffff;
        do {
          psVar7 = psVar6 + 1;
          pcVar1 = psVar6 + *(long *)(local_40 + 8) + 1;
          psVar6 = psVar7;
        } while (*pcVar1 != '\0');
      }
      QVar9.m_data = psVar7;
      QVar9.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar9);
      pcVar4 = pcStack_60;
      pQVar5 = local_68;
      pcVar1 = local_b8.a.b.m_data;
      pQVar2 = local_b8.a.a;
      local_b8.a.a = (QString *)local_68;
      local_68 = (QArrayData *)pQVar2;
      pcStack_60 = (char16_t *)local_b8.a.b.m_size;
      local_b8.a.b.m_size = (qsizetype)pcVar4;
      local_b8.a.b.m_data = local_58;
      local_58 = pcVar1;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
      if (*(long *)(local_40 + 0x20) == 0) {
        pcVar1 = *(char **)(local_40 + 0x10);
        psVar7 = (storage_type *)(long)*(int *)(local_40 + 0x18);
        bVar8 = (long)psVar7 < 0;
        if ((long)psVar7 < 1) {
          psVar7 = (storage_type *)0x0;
        }
        if (pcVar1 == (char *)0x0) {
          psVar7 = (storage_type *)0x0;
        }
        if (pcVar1 != (char *)0x0 && bVar8) {
          psVar7 = (storage_type *)strlen(pcVar1);
        }
        QVar11.m_data = psVar7;
        QVar11.m_size = (qsizetype)&local_b8;
        QString::fromLatin1(QVar11);
      }
      else {
        pcVar1 = *(char **)(local_40 + 0x10);
        psVar7 = (storage_type *)(long)(int)*(long *)(local_40 + 0x20);
        bVar8 = (long)psVar7 < 0;
        if ((long)psVar7 < 1) {
          psVar7 = (storage_type *)0x0;
        }
        if (pcVar1 == (char *)0x0) {
          psVar7 = (storage_type *)0x0;
        }
        if (pcVar1 != (char *)0x0 && bVar8) {
          psVar7 = (storage_type *)strlen(pcVar1);
        }
        QVar10.m_data = psVar7;
        QVar10.m_size = (qsizetype)&local_b8;
        QString::fromUtf8(QVar10);
      }
      pcVar4 = local_88.d.ptr;
      pDVar3 = local_88.d.d;
      pcVar1 = local_b8.a.b.m_data;
      pQVar2 = local_b8.a.a;
      local_b8.a.a = (QString *)local_88.d.d;
      local_88.d.d = (Data *)pQVar2;
      local_88.d.ptr = (char16_t *)local_b8.a.b.m_size;
      local_b8.a.b.m_size = (qsizetype)pcVar4;
      local_b8.a.b.m_data = (char *)local_88.d.size;
      local_88.d.size = (qsizetype)pcVar1;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      if ((this->description).d.size != 0) {
        QVar12.m_data = (char *)0x2;
        QVar12.m_size = (qsizetype)&this->description;
        QString::append(QVar12);
      }
      QString::simplified_helper(&local_d8);
      local_b8.b.d.size = local_d8.d.size;
      local_b8.b.d.ptr = local_d8.d.ptr;
      local_b8.b.d.d = local_d8.d.d;
      local_b8.a.b.m_size = 2;
      local_b8.a.b.m_data = ": ";
      local_d8.d.d = (Data *)0x0;
      local_d8.d.ptr = (char16_t *)0x0;
      local_d8.d.size = 0;
      local_b8.a.a = (QString *)&local_68;
      ::operator+=(&this->description,&local_b8);
      if (&(local_b8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)this_00,(this->readTexts).d.size,(QString *)&local_68)
      ;
      QList<QString>::end(this_00);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)this_00,(this->readTexts).d.size,&local_88);
      QList<QString>::end(this_00);
      local_40 = local_40 + 0x38;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar5 = local_68;
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&local_68->ref_)->d =
             *(int *)&((DataPointer *)&local_68->ref_)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&pQVar5->ref_)->d == 0) {
          QArrayData::deallocate(local_68,2,0x10);
        }
      }
      bVar8 = local_44 != 0;
      local_44 = local_44 + -1;
    } while (bVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPngHandlerPrivate::readPngTexts(png_info *info)
{
#ifndef QT_NO_IMAGEIO_TEXT_LOADING
    png_textp text_ptr;
    int num_text=0;
    png_get_text(png_ptr, info, &text_ptr, &num_text);

    while (num_text--) {
        QString key, value;
        key = QString::fromLatin1(text_ptr->key);
#if defined(PNG_iTXt_SUPPORTED)
        if (text_ptr->itxt_length) {
            value = QString::fromUtf8(text_ptr->text, int(text_ptr->itxt_length));
        } else
#endif
        {
            value = QString::fromLatin1(text_ptr->text, int(text_ptr->text_length));
        }
        if (!description.isEmpty())
            description += "\n\n"_L1;
        description += key + ": "_L1 + value.simplified();
        readTexts.append(key);
        readTexts.append(value);
        text_ptr++;
    }
#else
    Q_UNUSED(info);
#endif
}